

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatTest_ToWString_Test::TestBody(FormatTest_ToWString_Test *this)

{
  undefined1 uVar1;
  int *in_RDI;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  wstring *expected;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  wstring local_38 [32];
  AssertionResult local_18;
  
  uVar2 = 0x2a;
  expected = local_38;
  fmt::v5::to_wstring<int>(in_RDI);
  testing::internal::EqHelper<false>::Compare<wchar_t[3],std::__cxx11::wstring>
            ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa0,(wchar_t (*) [3])expected,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  std::__cxx11::wstring::~wstring(local_38);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar2,in_stack_ffffffffffffffc0));
    testing::AssertionResult::failure_message((AssertionResult *)0x18175a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff90));
    testing::Message::~Message((Message *)0x1817a6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1817e6);
  return;
}

Assistant:

TEST(FormatTest, ToWString) {
  EXPECT_EQ(L"42", fmt::to_wstring(42));
}